

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O1

void __thiscall
FDDSTexture::FDDSTexture(FDDSTexture *this,FileReader *lump,int lumpnum,void *vsurfdesc)

{
  undefined1 *puVar1;
  uint uVar2;
  DWORD DVar3;
  BYTE BVar4;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,lumpnum);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FDDSTexture_00865620;
  this->Pixels = (BYTE *)0x0;
  this->Spans = (Span **)0x0;
  (this->super_FTexture).UseType = '\b';
  (this->super_FTexture).LeftOffset = 0;
  (this->super_FTexture).TopOffset = 0;
  puVar1 = &(this->super_FTexture).field_0x31;
  *puVar1 = *puVar1 & 0xf7;
  (this->super_FTexture).Width = *(WORD *)((long)vsurfdesc + 0xc);
  (this->super_FTexture).Height = *(WORD *)((long)vsurfdesc + 8);
  FTexture::CalcBitSize(&this->super_FTexture);
  if ((*(byte *)((long)vsurfdesc + 0x4c) & 4) != 0) {
    this->Format = *(DWORD *)((long)vsurfdesc + 0x50);
    this->Pitch = 0;
    DVar3 = *(DWORD *)((long)vsurfdesc + 0x10);
    goto LAB_0063075d;
  }
  uVar2 = *(uint *)((long)vsurfdesc + 0x54) >> 3;
  this->Format = uVar2;
  DVar3 = *(DWORD *)((long)vsurfdesc + 0x58);
  this->RMask = DVar3;
  if (DVar3 == 0) {
    this->RShiftR = '\0';
    this->RShiftL = '\0';
  }
  else {
    if ((int)DVar3 < 0) {
      BVar4 = '\0';
    }
    else {
      BVar4 = '\0';
      do {
        DVar3 = DVar3 * 2;
        BVar4 = BVar4 + '\x01';
      } while (-1 < (int)DVar3);
    }
    this->RShiftL = BVar4;
    BVar4 = '\0';
    do {
      DVar3 = DVar3 * 2;
      BVar4 = BVar4 + '\x01';
    } while ((int)DVar3 < 0);
    this->RShiftR = BVar4;
  }
  DVar3 = *(DWORD *)((long)vsurfdesc + 0x5c);
  this->GMask = DVar3;
  if (DVar3 == 0) {
    this->GShiftR = '\0';
    this->GShiftL = '\0';
  }
  else {
    if ((int)DVar3 < 0) {
      BVar4 = '\0';
    }
    else {
      BVar4 = '\0';
      do {
        DVar3 = DVar3 * 2;
        BVar4 = BVar4 + '\x01';
      } while (-1 < (int)DVar3);
    }
    this->GShiftL = BVar4;
    BVar4 = '\0';
    do {
      DVar3 = DVar3 * 2;
      BVar4 = BVar4 + '\x01';
    } while ((int)DVar3 < 0);
    this->GShiftR = BVar4;
  }
  DVar3 = *(DWORD *)((long)vsurfdesc + 0x60);
  this->BMask = DVar3;
  if (DVar3 == 0) {
    this->BShiftR = '\0';
    this->BShiftL = '\0';
  }
  else {
    if ((int)DVar3 < 0) {
      BVar4 = '\0';
    }
    else {
      BVar4 = '\0';
      do {
        DVar3 = DVar3 * 2;
        BVar4 = BVar4 + '\x01';
      } while (-1 < (int)DVar3);
    }
    this->BShiftL = BVar4;
    BVar4 = '\0';
    do {
      DVar3 = DVar3 * 2;
      BVar4 = BVar4 + '\x01';
    } while ((int)DVar3 < 0);
    this->BShiftR = BVar4;
  }
  if ((*(byte *)((long)vsurfdesc + 0x4c) & 1) == 0) {
    this->AMask = 0;
LAB_0063070e:
    this->AShiftR = '\0';
    this->AShiftL = '\0';
  }
  else {
    DVar3 = *(DWORD *)((long)vsurfdesc + 100);
    this->AMask = DVar3;
    if (DVar3 == 0) goto LAB_0063070e;
    if ((int)DVar3 < 0) {
      BVar4 = '\0';
    }
    else {
      BVar4 = '\0';
      do {
        DVar3 = DVar3 * 2;
        BVar4 = BVar4 + '\x01';
      } while (-1 < (int)DVar3);
    }
    this->AShiftL = BVar4;
    BVar4 = '\0';
    do {
      DVar3 = DVar3 * 2;
      BVar4 = BVar4 + '\x01';
    } while ((int)DVar3 < 0);
    this->AShiftR = BVar4;
  }
  if ((*(byte *)((long)vsurfdesc + 4) & 8) == 0) {
    uVar2 = uVar2 * (this->super_FTexture).Width + 3 & 0xfffffffc;
  }
  else {
    uVar2 = *(uint *)((long)vsurfdesc + 0x10);
  }
  this->Pitch = uVar2;
  DVar3 = (this->super_FTexture).Height * uVar2;
LAB_0063075d:
  this->LinearSize = DVar3;
  return;
}

Assistant:

FDDSTexture::FDDSTexture (FileReader &lump, int lumpnum, void *vsurfdesc)
: FTexture(NULL, lumpnum), Pixels(0), Spans(0)
{
	DDSURFACEDESC2 *surf = (DDSURFACEDESC2 *)vsurfdesc;

	UseType = TEX_MiscPatch;
	LeftOffset = 0;
	TopOffset = 0;
	bMasked = false;

	Width = WORD(surf->Width);
	Height = WORD(surf->Height);
	CalcBitSize ();

	if (surf->PixelFormat.Flags & DDPF_FOURCC)
	{
		Format = surf->PixelFormat.FourCC;
		Pitch = 0;
		LinearSize = surf->LinearSize;
	}
	else	// DDPF_RGB
	{
		Format = surf->PixelFormat.RGBBitCount >> 3;
		CalcBitShift (RMask = surf->PixelFormat.RBitMask, &RShiftL, &RShiftR);
		CalcBitShift (GMask = surf->PixelFormat.GBitMask, &GShiftL, &GShiftR);
		CalcBitShift (BMask = surf->PixelFormat.BBitMask, &BShiftL, &BShiftR);
		if (surf->PixelFormat.Flags & DDPF_ALPHAPIXELS)
		{
			CalcBitShift (AMask = surf->PixelFormat.RGBAlphaBitMask, &AShiftL, &AShiftR);
		}
		else
		{
			AMask = 0;
			AShiftL = AShiftR = 0;
		}
		if (surf->Flags & DDSD_PITCH)
		{
			Pitch = surf->Pitch;
		}
		else
		{
			Pitch = (Width * Format + 3) & ~3;
		}
		LinearSize = Pitch * Height;
	}
}